

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O3

size_t MOJOSHADER_printFloat(char *text,size_t maxlen,float arg)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  uint uVar5;
  ulong uVar6;
  ulong __maxlen;
  bool bVar7;
  bool bVar8;
  float fVar9;
  undefined1 auVar10 [16];
  float fVar11;
  
  if (NAN(arg)) {
    if (3 < maxlen) {
      snprintf(text,maxlen,"NaN");
    }
    pcVar4 = text + 3;
    goto LAB_0011fa9d;
  }
  if (ABS(arg) == INFINITY) {
    if (3 < maxlen) {
      pcVar4 = "inf";
LAB_0011f930:
      snprintf(text,maxlen,pcVar4);
    }
  }
  else {
    if ((arg != 0.0) || (NAN(arg))) {
      pcVar4 = text;
      if (arg < 0.0) {
        if (1 < maxlen) {
          *text = '-';
          maxlen = maxlen - 1;
        }
        arg = -arg;
        pcVar4 = text + 1;
      }
      uVar6 = (long)(arg - 9.223372e+18) & (long)arg >> 0x3f | (long)arg;
      iVar1 = snprintf(pcVar4,maxlen,"%lu",uVar6);
      uVar3 = (ulong)iVar1;
      __maxlen = (ulong)(maxlen != 0);
      if (uVar3 <= maxlen && maxlen - uVar3 != 0) {
        __maxlen = maxlen - uVar3;
      }
      if (1 < __maxlen) {
        pcVar4[uVar3] = '.';
        __maxlen = __maxlen - 1;
      }
      fVar11 = arg - (float)uVar6;
      pcVar4 = pcVar4 + uVar3 + 1;
      uVar5 = 10;
      iVar1 = 10;
      do {
        uVar3 = (ulong)((float)iVar1 * fVar11);
        uVar3 = (long)((float)iVar1 * fVar11 - 9.223372e+18) & (long)uVar3 >> 0x3f | uVar3;
        iVar2 = snprintf(pcVar4,__maxlen,"%lu",uVar3);
        uVar6 = (ulong)iVar2;
        pcVar4 = pcVar4 + uVar6;
        bVar8 = __maxlen != 0;
        bVar7 = __maxlen < uVar6;
        __maxlen = __maxlen - uVar6;
        if (bVar7 || __maxlen == 0) {
          __maxlen = (ulong)bVar8;
        }
        auVar10._8_4_ = (int)(uVar3 >> 0x20);
        auVar10._0_8_ = uVar3;
        auVar10._12_4_ = 0x45300000;
        fVar9 = (float)((double)fVar11 -
                       ((auVar10._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) /
                       (double)iVar1);
        fVar11 = -fVar9;
        if (-fVar9 <= fVar9) {
          fVar11 = fVar9;
        }
        iVar1 = iVar1 * 10;
        uVar5 = uVar5 - 1;
      } while (1 < uVar5);
      goto LAB_0011fa9d;
    }
    if (3 < maxlen) {
      pcVar4 = "0.0";
      goto LAB_0011f930;
    }
  }
  pcVar4 = text + 3;
LAB_0011fa9d:
  return (long)pcVar4 - (long)text;
}

Assistant:

size_t MOJOSHADER_printFloat(char *text, size_t maxlen, float arg)
{
    size_t len;
    size_t left = maxlen;
    char *textstart = text;

    int precision = 9;

    if (isnan(arg))
    {
        if (left > 3)
        {
            snprintf(text, left, "NaN");
            left -= 3;
        } // if
        text += 3;
    } // if
    else if (isinf(arg))
    {
        if (left > 3)
        {
            snprintf(text, left, "inf");
            left -= 3;
        } // if
        text += 3;
    } // else if
    else if (arg)
    {
        /* This isn't especially accurate, but hey, it's easy. :) */
        unsigned long value;

        if (arg < 0)
        {
            if (left > 1)
            {
                *text = '-';
                --left;
            } // if
            ++text;
            arg = -arg;
        } // if
        value = (unsigned long) arg;
        len = snprintf(text, left, "%lu", value);
        text += len;
        if (len >= left)
            left = (left < 1) ? left : 1;
        else
            left -= len;
        arg -= value;

        int mult = 10;
        if (left > 1)
        {
            *text = '.';
            --left;
        } // if
        ++text;
        while (precision-- > 0)
        {
            value = (unsigned long) (arg * mult);
            len = snprintf(text, left, "%lu", value);
            text += len;
            if (len >= left)
                left = (left < 1) ? left : 1;
            else
                left -= len;
            arg -= (double) value / mult;
            if (arg < 0) arg = -arg; // Sometimes that bit gets flipped...
            mult *= 10;
        } // while
    } // if
    else
    {
        if (left > 3)
        {
            snprintf(text, left, "0.0");
            left -= 3;
        } // if
        text += 3;
    } // else

    return (text - textstart);
}